

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reed_solomn_reconstruct.cpp
# Opt level: O1

vector<__int128,_std::allocator<__int128>_> * __thiscall
reed_solomn::poly_scalar_div
          (vector<__int128,_std::allocator<__int128>_> *__return_storage_ptr__,reed_solomn *this,
          vector<__int128,_std::allocator<__int128>_> *A,ll128 scalar)

{
  ulong uVar1;
  long lVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  pointer p_Var7;
  ll128 *plVar8;
  reed_solomn *in_RCX;
  long extraout_RDX;
  reed_solomn *this_00;
  long lVar9;
  ulong uVar10;
  undefined1 auVar11 [16];
  _func_int **pp_Var12;
  undefined1 (*pauVar13) [16];
  vector<__int128,_std::allocator<__int128>_> local_60;
  undefined1 local_48 [16];
  
  this_00 = (reed_solomn *)&stack0xffffffffffffff68;
  pp_Var12 = (_func_int **)0x0;
  pauVar13 = (undefined1 (*) [16])0x0;
  p_Var7 = (A->super__Vector_base<__int128,_std::allocator<__int128>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((A->super__Vector_base<__int128,_std::allocator<__int128>_>)._M_impl.super__Vector_impl_data.
      _M_finish != p_Var7) {
    lVar9 = 0;
    uVar10 = 0;
    do {
      uVar1 = *(ulong *)((long)p_Var7 + lVar9);
      lVar2 = *(long *)((long)p_Var7 + lVar9 + 8);
      auVar6._8_8_ = pauVar13;
      auVar6._0_8_ = pp_Var12;
      plVar8 = base_inverse((ll128 *)this,in_RCX,(ll128)auVar6);
      auVar11._8_8_ = 0;
      auVar11._0_8_ = plVar8;
      auVar5._8_8_ = 0;
      auVar5._0_8_ = uVar1;
      uVar3 = (undefined8)this->PRIME;
      uVar4 = *(undefined8 *)((long)&this->PRIME + 8);
      auVar6 = (undefined1  [16])this->PRIME;
      auVar11 = __modti3(SUB168(auVar11 * auVar5,0),
                         extraout_RDX * uVar1 + lVar2 * (long)plVar8 + SUB168(auVar11 * auVar5,8),
                         uVar3,uVar4);
      auVar11 = auVar11 + auVar6;
      auVar11 = __modti3(auVar11._0_8_,auVar11._8_8_,uVar3,uVar4);
      local_48 = auVar11;
      if (pauVar13 == (undefined1 (*) [16])0x0) {
        std::vector<__int128,_std::allocator<__int128>_>::_M_realloc_insert<__int128>
                  ((vector<__int128,_std::allocator<__int128>_> *)&stack0xffffffffffffff68,
                   (iterator)0x0,(__int128 *)local_48);
      }
      else {
        *pauVar13 = auVar11;
        pauVar13 = pauVar13 + 1;
      }
      uVar10 = uVar10 + 1;
      p_Var7 = (A->super__Vector_base<__int128,_std::allocator<__int128>_>)._M_impl.
               super__Vector_impl_data._M_start;
      lVar9 = lVar9 + 0x10;
    } while (uVar10 < (ulong)((long)(A->super__Vector_base<__int128,_std::allocator<__int128>_>).
                                    _M_impl.super__Vector_impl_data._M_finish - (long)p_Var7 >> 4));
  }
  std::vector<__int128,_std::allocator<__int128>_>::vector
            (&local_60,(vector<__int128,_std::allocator<__int128>_> *)&stack0xffffffffffffff68);
  poly_strip(__return_storage_ptr__,this_00,&local_60);
  if (local_60.super__Vector_base<__int128,_std::allocator<__int128>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_60.super__Vector_base<__int128,_std::allocator<__int128>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_60.super__Vector_base<__int128,_std::allocator<__int128>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.super__Vector_base<__int128,_std::allocator<__int128>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (pp_Var12 != (_func_int **)0x0) {
    operator_delete(pp_Var12,-(long)pp_Var12);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<ll128> reed_solomn::poly_scalar_div(vector<ll128> A, ll128 scalar) {
    vector<ll128> res;
    for (int i = 0; i < A.size(); ++i) {
        res.push_back(base_mul(A[i], base_inverse(scalar)));
    }
    return poly_strip(res);
}